

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContrExprCounter.h
# Opt level: O1

void __thiscall phaeton::ContrExprCounter::visitAddExpr(ContrExprCounter *this,AddExpr *E)

{
  ExpressionNode *pEVar1;
  long lVar2;
  
  if (0 < (E->super_ExpressionNode).NumChildren) {
    lVar2 = 0;
    do {
      pEVar1 = (E->super_ExpressionNode).Children.
               super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar2];
      (*pEVar1->_vptr_ExpressionNode[4])(pEVar1,this);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (E->super_ExpressionNode).NumChildren);
  }
  return;
}

Assistant:

void visitChildren(const ExpressionNode *EN) {
    for (int I = 0; I < EN->getNumChildren(); ++I) {
      EN->getChild(I)->visit(this);
    }
  }